

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::Promise<kj::HttpClient::Response>_>::dispose
          (Array<kj::Promise<kj::HttpClient::Response>_> *this)

{
  Promise<kj::HttpClient::Response> *pPVar1;
  size_t sVar2;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (Promise<kj::HttpClient::Response> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Promise<kj::HttpClient::Response> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pPVar1,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Promise<kj::HttpClient::Response>_>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }